

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool op_s_rrr_shr(DisasContext_conflict1 *s,arg_s_rrr_shr *a,
                  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict1 *gen,int logic_cc,
                  StoreRegKind kind)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  TCGv_i32 pTVar2;
  TCGv_i32 var;
  TCGv_i32 tmp2;
  TCGv_i32 tmp1;
  TCGContext_conflict1 *tcg_ctx;
  StoreRegKind kind_local;
  int logic_cc_local;
  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict1 *gen_local;
  arg_s_rrr_shr *a_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  pTVar2 = load_reg(s,a->rs);
  var = load_reg(s,a->rm);
  gen_arm_shift_reg(tcg_ctx_00,var,a->shty,pTVar2,logic_cc);
  pTVar2 = load_reg(s,a->rn);
  (*gen)(tcg_ctx_00,pTVar2,pTVar2,var);
  tcg_temp_free_i32(tcg_ctx_00,var);
  if (logic_cc != 0) {
    gen_logic_CC(tcg_ctx_00,pTVar2);
  }
  _Var1 = store_reg_kind(s,a->rd,pTVar2,kind);
  return _Var1;
}

Assistant:

static bool op_s_rrr_shr(DisasContext *s, arg_s_rrr_shr *a,
                         void (*gen)(TCGContext *, TCGv_i32, TCGv_i32, TCGv_i32),
                         int logic_cc, StoreRegKind kind)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp1, tmp2;

    tmp1 = load_reg(s, a->rs);
    tmp2 = load_reg(s, a->rm);
    gen_arm_shift_reg(tcg_ctx, tmp2, a->shty, tmp1, logic_cc);
    tmp1 = load_reg(s, a->rn);

    gen(tcg_ctx, tmp1, tmp1, tmp2);
    tcg_temp_free_i32(tcg_ctx, tmp2);

    if (logic_cc) {
        gen_logic_CC(tcg_ctx, tmp1);
    }
    return store_reg_kind(s, a->rd, tmp1, kind);
}